

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTestContiguous.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionTestContiguous::write_cpp
          (InstructionTestContiguous *this,StreamSepMaker *ss,StreamSepMaker *es,
          CppEmitter *cpp_emitter)

{
  pointer pTVar1;
  StreamSep *pSVar2;
  uint local_70;
  int local_6c;
  StreamSep local_68;
  
  pTVar1 = (this->super_Instruction).next.
           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(this->super_Instruction).next.
            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar1 == 0x28) {
    StreamSepMaker::operator<<(&local_68,ss,(char (*) [9])0x177e1e);
    local_70 = this->nb_chars - (uint)(byte)(this->super_Instruction).field_0x174;
    pSVar2 = StreamSep::operator<<(&local_68,&local_70);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x1775c3);
  }
  else {
    if (cpp_emitter->buffer_type == 3) {
      if ((pTVar1[1].inst)->num_ordering == (this->super_Instruction).num_ordering + 1) {
        return;
      }
      StreamSepMaker::operator<<(&local_68,ss,(char (*) [8])0x177f34);
      local_70 = Instruction::get_id_gen
                           ((this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      pSVar2 = StreamSep::operator<<(&local_68,(int *)&local_70);
      StreamSep::operator<<(pSVar2,(char (*) [2])0x1775c3);
      StreamSep::~StreamSep(&local_68);
      return;
    }
    StreamSepMaker::operator<<(&local_68,ss,(char (*) [13])"if ( data + ");
    local_70 = this->nb_chars - (uint)(byte)(this->super_Instruction).field_0x174;
    pSVar2 = StreamSep::operator<<(&local_68,&local_70);
    pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [20])" > end_m1 ) goto l_");
    local_6c = Instruction::get_id_gen
                         ((this->super_Instruction).next.
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
    pSVar2 = StreamSep::operator<<(pSVar2,&local_6c);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x1775c3);
    StreamSep::~StreamSep(&local_68);
    StreamSepMaker::operator<<(&local_68,ss,(char (*) [9])0x177e1e);
    local_70 = this->nb_chars - (uint)(byte)(this->super_Instruction).field_0x174;
    pSVar2 = StreamSep::operator<<(&local_68,&local_70);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x1775c3);
  }
  StreamSep::~StreamSep(&local_68);
  Instruction::write_trans(&this->super_Instruction,ss,cpp_emitter,0);
  return;
}

Assistant:

void InstructionTestContiguous::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( next.size() == 1 ) {
        ss << "data += " << nb_chars - beg << ";";
        return write_trans( ss, cpp_emitter );
    }
    
    if ( cpp_emitter->buffer_type == CppEmitter::BT_C_STR ) {
        if ( next[ 1 ].inst->num_ordering != num_ordering + 1 )
            ss << "goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
    } else {
        ss << "if ( data + " << nb_chars - beg << " > end_m1 ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "data += " << nb_chars - beg << ";";
        write_trans( ss, cpp_emitter );
    }
}